

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O1

void xx(int line_no,int n,char **ps,char *s,int from,int to,int mem,int not,int error_no)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  char *__format;
  OnigRegSet *set;
  int match_pos;
  char buf [1000];
  
  iVar1 = make_regset(line_no,n,ps,&set,from);
  if (iVar1 != 0) {
    return;
  }
  sVar2 = strlen(s);
  iVar1 = onig_regset_search(set,s,s + sVar2,s,s + sVar2,XX_LEAD,0,&match_pos);
  if (iVar1 < 0) {
    if (iVar1 != -1) {
      xx_cold_2();
      goto LAB_00102c88;
    }
    if (not != 0) {
      fprintf(_stdout,"OK(N): %d\n",line_no);
      nsucc = nsucc + 1;
      goto LAB_00102c88;
    }
    __format = "FAIL: %d\n";
  }
  else {
    if (not == 0) {
      lVar3 = onig_regset_get_region(set,iVar1);
      if (lVar3 == 0) {
        xx_cold_1();
      }
      else {
        uVar5 = (ulong)(uint)mem;
        if ((*(int *)(*(long *)(lVar3 + 8) + uVar5 * 4) == from) &&
           (*(int *)(*(long *)(lVar3 + 0x10) + uVar5 * 4) == to)) {
          fprintf(_stdout,"OK: %d\n",line_no);
          nsucc = nsucc + 1;
        }
        else {
          lVar4 = (long)*(int *)(*(long *)(lVar3 + 8) + uVar5 * 4);
          sVar2 = *(int *)(*(long *)(lVar3 + 0x10) + uVar5 * 4) - lVar4;
          strncpy(buf,s + lVar4,sVar2);
          buf[sVar2] = '\0';
          fprintf(_stdout,"FAIL: %d: %d-%d : %d-%d (%s)\n",line_no,(ulong)(uint)from,(ulong)(uint)to
                  ,(ulong)*(uint *)(*(long *)(lVar3 + 8) + uVar5 * 4),
                  (ulong)*(uint *)(*(long *)(lVar3 + 0x10) + uVar5 * 4),buf);
          nfail = nfail + 1;
        }
      }
      if (lVar3 == 0) {
        return;
      }
      goto LAB_00102c88;
    }
    __format = "FAIL(N): %d\n";
  }
  fprintf(_stdout,__format,line_no);
  nfail = nfail + 1;
LAB_00102c88:
  onig_regset_free(set);
  return;
}

Assistant:

static void
xx(int line_no, int n, char* ps[], char* s, int from, int to, int mem, int not, int error_no)
{
  int r;
  int match_pos;
  int match_index;
  OnigRegSet* set;
  char *end;

  r = make_regset(line_no, n, ps, &set, error_no);
  if (r != 0) return ;

  end = s + strlen(s);

  r = onig_regset_search(set, (UChar* )s, (UChar* )end, (UChar* )s, (UChar* )end,
                         XX_LEAD, ONIG_OPTION_NONE, &match_pos);
  if (r < 0) {
    if (r == ONIG_MISMATCH) {
      if (not) {
        fprintf(stdout, "OK(N): %d\n", line_no);
        nsucc++;
      }
      else {
        fprintf(stdout, "FAIL: %d\n", line_no);
        nfail++;
      }
    }
    else {
      if (error_no == 0) {
        char buf[ONIG_MAX_ERROR_MESSAGE_LEN];
        onig_error_code_to_str((UChar* )buf, r);
        fprintf(stderr, "ERROR: %d: %s\n", line_no, buf);
        nerror++;
      }
      else {
        if (r == error_no) {
          fprintf(stdout, "OK(ERROR): %d: %d\n", line_no, r);
          nsucc++;
        }
        else {
          fprintf(stdout, "FAIL ERROR NO: %d: %d, %d\n", line_no, error_no, r);
          nfail++;
        }
      }
    }
  }
  else {
    if (not) {
      fprintf(stdout, "FAIL(N): %d\n", line_no);
      nfail++;
    }
    else {
      OnigRegion* region;

      match_index = r;
      region = onig_regset_get_region(set, match_index);
      if (region == 0) {
        fprintf(stderr, "ERROR: %d: can't get region.\n", line_no);
        nerror++;
        onig_regset_free(set);
        return ;
      }

      if (region->beg[mem] == from && region->end[mem] == to) {
        fprintf(stdout, "OK: %d\n", line_no);
        nsucc++;
      }
      else {
        char buf[1000];
        int len;
        len = region->end[mem] - region->beg[mem];
        strncpy(buf, s + region->beg[mem], len);
        buf[len] = '\0';
        fprintf(stdout, "FAIL: %d: %d-%d : %d-%d (%s)\n", line_no,
                from, to, region->beg[mem], region->end[mem], buf);
        nfail++;
      }
    }
  }

  onig_regset_free(set);
}